

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.h
# Opt level: O0

void __thiscall IntVar::printLit(IntVar *this,int val,LitRel type)

{
  undefined4 in_EDX;
  uint in_ESI;
  long in_RDI;
  
  printf("[v%d ",(ulong)*(uint *)(in_RDI + 8));
  switch(in_EDX) {
  case 0:
    printf("!= %d]",(ulong)in_ESI);
    break;
  case 1:
    printf("== %d]",(ulong)in_ESI);
    break;
  case 2:
    printf(">= %d]",(ulong)(in_ESI + 1));
    break;
  case 3:
    printf("<= %d]",(ulong)in_ESI);
  }
  return;
}

Assistant:

inline void IntVar::printLit(int val, LitRel type) const {
		printf("[v%d ", var_id);
		switch (type) {
			case LR_NE:
				printf("!= %d]", val);
				break;
			case LR_EQ:
				printf("== %d]", val);
				break;
			case LR_GE:
				printf(">= %d]", val + 1);
				break;
			case LR_LE:
				printf("<= %d]", val);
				break;
		}
	}